

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O0

EStatusCode __thiscall
PDFDocumentHandler::OnResourcesWrite
          (PDFDocumentHandler *this,ResourcesDictionary *inResources,
          DictionaryContext *inPageResourcesDictionaryContext,
          ObjectsContext *inPDFWriterObjectContext,DocumentContext *inPDFWriterDocumentContext)

{
  size_t *this_00;
  bool bVar1;
  PDFObject *inPDFObject;
  PDFDictionary *this_01;
  key_type this_02;
  string *inKey;
  mapped_type inObject;
  undefined1 local_a8 [8];
  OutWritingPolicy writingPolicy;
  undefined1 local_88 [4];
  EStatusCode status;
  MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
  it;
  undefined1 local_60 [8];
  ObjectIDTypeList dummyObjectList;
  PDFObjectCastPtr<PDFDictionary> resources;
  DocumentContext *inPDFWriterDocumentContext_local;
  ObjectsContext *inPDFWriterObjectContext_local;
  DictionaryContext *inPageResourcesDictionaryContext_local;
  ResourcesDictionary *inResources_local;
  PDFDocumentHandler *this_local;
  
  inPDFObject = FindPageResources(this,this->mParser,this->mWrittenPage);
  this_00 = &dummyObjectList.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             ._M_node._M_size;
  PDFObjectCastPtr<PDFDictionary>::PDFObjectCastPtr
            ((PDFObjectCastPtr<PDFDictionary> *)this_00,inPDFObject);
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_60);
  bVar1 = RefCountPtr<PDFDictionary>::operator!((RefCountPtr<PDFDictionary> *)this_00);
  if (bVar1) {
    this_local._4_4_ = eSuccess;
  }
  else {
    this_01 = RefCountPtr<PDFDictionary>::operator->
                        ((RefCountPtr<PDFDictionary> *)
                         &dummyObjectList.
                          super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          _M_node._M_size);
    PDFDictionary::GetIterator
              ((MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                *)local_88,this_01);
    writingPolicy.mSourceObjectsToAdd._4_4_ = eSuccess;
    OutWritingPolicy::OutWritingPolicy
              ((OutWritingPolicy *)local_a8,this,(ObjectIDTypeList *)local_60);
    while (bVar1 = ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                   ::MoveNext((ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                               *)local_88),
          bVar1 && writingPolicy.mSourceObjectsToAdd._4_4_ == eSuccess) {
      this_02 = MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                ::GetKey((MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                          *)local_88);
      inKey = PDFName::GetValue_abi_cxx11_(this_02);
      writingPolicy.mSourceObjectsToAdd._4_4_ =
           DictionaryContext::WriteKey(inPageResourcesDictionaryContext,inKey);
      if (writingPolicy.mSourceObjectsToAdd._4_4_ == eSuccess) {
        inObject = MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                   ::GetValue((MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                               *)local_88);
        writingPolicy.mSourceObjectsToAdd._4_4_ =
             WriteObjectByType(this,inObject,eTokenSeparatorEndLine,(IObjectWritePolicy *)local_a8);
      }
    }
    this_local._4_4_ = writingPolicy.mSourceObjectsToAdd._4_4_;
  }
  it.
  super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
  .mCurrentPosition._M_node._0_4_ = 1;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::~list
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_60);
  PDFObjectCastPtr<PDFDictionary>::~PDFObjectCastPtr
            ((PDFObjectCastPtr<PDFDictionary> *)
             &dummyObjectList.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl._M_node._M_size);
  return this_local._4_4_;
}

Assistant:

EStatusCode PDFDocumentHandler::OnResourcesWrite(
						ResourcesDictionary* inResources,
						DictionaryContext* inPageResourcesDictionaryContext,
						ObjectsContext* inPDFWriterObjectContext,
						DocumentContext* inPDFWriterDocumentContext)
{
	// Writing resources dictionary. simply loop internal elements and copy. nicely enough, i can use read methods, trusting
	// that no new objects need be written
	
	PDFObjectCastPtr<PDFDictionary> resources(FindPageResources(mParser, mWrittenPage));
	ObjectIDTypeList dummyObjectList; // this one should remain empty...

	// k. no resources...as wierd as that might be...or just wrong...i'll let it be
	if(!resources)
		return PDFHummus::eSuccess;

	MapIterator<PDFNameToPDFObjectMap> it(resources->GetIterator());
	EStatusCode status = PDFHummus::eSuccess;
	OutWritingPolicy writingPolicy(this, dummyObjectList);

	while(it.MoveNext() && PDFHummus::eSuccess == status)
	{
		status = inPageResourcesDictionaryContext->WriteKey(it.GetKey()->GetValue());
		if(PDFHummus::eSuccess == status)
			status = WriteObjectByType(it.GetValue(),eTokenSeparatorEndLine, &writingPolicy);
	}
	return status;
}